

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::_::XThreadEvent_*> * __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent_*>::operator=
          (ArrayBuilder<kj::_::XThreadEvent_*> *this,ArrayBuilder<kj::_::XThreadEvent_*> *other)

{
  ArrayBuilder<kj::_::XThreadEvent_*> *other_local;
  ArrayBuilder<kj::_::XThreadEvent_*> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (XThreadEvent **)0x0;
  other->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  other->endPtr = (XThreadEvent **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }